

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ArrayJoinPromiseNode<void>::~ArrayJoinPromiseNode(ArrayJoinPromiseNode<void> *this)

{
  Array<kj::_::ExceptionOr<kj::_::Void>_>::~Array(&this->resultParts);
  ArrayJoinPromiseNodeBase::~ArrayJoinPromiseNodeBase(&this->super_ArrayJoinPromiseNodeBase);
  return;
}

Assistant:

ArrayJoinPromiseNode<void>::~ArrayJoinPromiseNode() {}